

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

int bitset_container_to_uint32_array(uint32_t *out,bitset_container_t *bc,uint32_t base)

{
  uint uVar1;
  int iVar2;
  size_t sVar3;
  int *in_RSI;
  uint32_t *in_RDI;
  uint64_t *unaff_retaddr;
  int support;
  uint32_t in_stack_0000028c;
  size_t in_stack_00000290;
  uint32_t *in_stack_00000298;
  size_t in_stack_000002a0;
  uint64_t *in_stack_000002a8;
  uint32_t in_stack_0000066c;
  size_t in_stack_00000670;
  uint32_t *in_stack_00000678;
  size_t in_stack_00000680;
  uint64_t *in_stack_00000688;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  uVar1 = croaring_hardware_support();
  if (((uVar1 & 2) == 0) || (*in_RSI < 0x2000)) {
    if (((uVar1 & 1) == 0) || (*in_RSI < 0x2000)) {
      sVar3 = bitset_extract_setbits
                        (unaff_retaddr,CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8)
                         ,in_RDI,(uint32_t)((ulong)in_RSI >> 0x20));
      iVar2 = (int)sVar3;
    }
    else {
      sVar3 = bitset_extract_setbits_avx2
                        (in_stack_000002a8,in_stack_000002a0,in_stack_00000298,in_stack_00000290,
                         in_stack_0000028c);
      iVar2 = (int)sVar3;
    }
  }
  else {
    sVar3 = bitset_extract_setbits_avx512
                      (in_stack_00000688,in_stack_00000680,in_stack_00000678,in_stack_00000670,
                       in_stack_0000066c);
    iVar2 = (int)sVar3;
  }
  return iVar2;
}

Assistant:

int bitset_container_to_uint32_array(
    uint32_t *out,
    const bitset_container_t *bc,
    uint32_t base
){
#if CROARING_IS_X64
   int support = croaring_hardware_support();
#if CROARING_COMPILER_SUPPORTS_AVX512
   if(( support & ROARING_SUPPORTS_AVX512 ) &&  (bc->cardinality >= 8192))  // heuristic
		return (int) bitset_extract_setbits_avx512(bc->words,
                BITSET_CONTAINER_SIZE_IN_WORDS, out, bc->cardinality, base);
   else
#endif
   if(( support & ROARING_SUPPORTS_AVX2 ) &&  (bc->cardinality >= 8192))  // heuristic
		return (int) bitset_extract_setbits_avx2(bc->words,
                BITSET_CONTAINER_SIZE_IN_WORDS, out, bc->cardinality, base);
	else
		return (int) bitset_extract_setbits(bc->words,
                BITSET_CONTAINER_SIZE_IN_WORDS, out, base);
#else
	return (int) bitset_extract_setbits(bc->words,
                BITSET_CONTAINER_SIZE_IN_WORDS, out, base);
#endif
}